

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

mat33 * nifti_mat33_polar(mat33 A)

{
  mat33 A_00;
  mat33 R;
  mat33 A_01;
  mat33 A_02;
  mat33 A_03;
  mat33 A_04;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  mat33 *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  float in_stack_00000028;
  mat33 X;
  float local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  
  local_c8 = in_stack_00000008;
  uVar3 = local_c8;
  uStack_c0 = in_stack_00000010;
  uVar1 = uStack_c0;
  local_b8 = in_stack_00000018;
  uVar4 = local_b8;
  uStack_b0 = in_stack_00000020;
  uVar2 = uStack_b0;
  local_a8 = in_stack_00000028;
  local_c8._0_4_ = (float)in_stack_00000008;
  local_c8._4_4_ = (float)((ulong)in_stack_00000008 >> 0x20);
  uStack_c0._0_4_ = (float)in_stack_00000010;
  uStack_c0._4_4_ = (float)((ulong)in_stack_00000010 >> 0x20);
  local_b8._0_4_ = (float)in_stack_00000018;
  local_b8._4_4_ = (float)((ulong)in_stack_00000018 >> 0x20);
  fVar10 = local_b8._4_4_;
  uStack_b0._0_4_ = (float)in_stack_00000020;
  uStack_b0._4_4_ = (float)((ulong)in_stack_00000020 >> 0x20);
  fVar7 = -uStack_c0._4_4_ * local_c8._4_4_;
  fVar9 = uStack_c0._4_4_ * uStack_b0._4_4_ * (float)uStack_c0;
  fVar8 = local_c8._4_4_ * (float)uStack_b0 * local_b8._4_4_;
  fVar15 = (in_stack_00000028 * fVar7 +
            ((float)local_c8 * (float)local_b8 * in_stack_00000028 -
            (float)local_c8 * uStack_b0._4_4_ * local_b8._4_4_) + fVar9 + fVar8) -
           (float)local_b8 * (float)uStack_b0 * (float)uStack_c0;
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    fVar15 = (float)local_b8;
    fVar14 = (float)local_c8;
    local_c8 = uVar3;
    local_b8 = uVar4;
    do {
      A_00.m._8_8_ = in_stack_00000010;
      A_00.m[0][0] = (float)local_c8;
      A_00.m[0][1] = local_c8._4_4_;
      A_00.m[1][1] = (float)local_b8;
      A_00.m[1][2] = local_b8._4_4_;
      A_00.m[2]._0_8_ = in_stack_00000020;
      A_00.m[2][2] = local_a8;
      fVar6 = nifti_mat33_rownorm(A_00);
      fVar6 = (fVar6 + 0.001) * 1e-05;
      fVar14 = fVar14 + fVar6;
      fVar15 = fVar15 + fVar6;
      local_a8 = local_a8 + fVar6;
      local_c8 = CONCAT44(local_c8._4_4_,fVar14);
      local_b8 = CONCAT44(local_b8._4_4_,fVar15);
      uVar3 = local_c8;
      uVar4 = local_b8;
    } while (fVar15 * -(float)uStack_b0 * (float)uStack_c0 +
             local_a8 * fVar7 + (fVar14 * fVar15 * local_a8 - uStack_b0._4_4_ * fVar14 * fVar10) +
             fVar9 + fVar8 == 0.0);
  }
  local_b8 = uVar4;
  local_c8 = uVar3;
  uVar5 = 0;
  local_d0 = 1.0;
  uStack_c0 = uVar1;
  uStack_b0 = uVar2;
  while( true ) {
    R.m[0][2] = (float)uStack_c0;
    R.m[1][0] = uStack_c0._4_4_;
    R.m[0][0] = (float)local_c8;
    R.m[0][1] = local_c8._4_4_;
    R.m[1][1] = (float)local_b8;
    R.m[1][2] = local_b8._4_4_;
    R.m[2][0] = (float)uStack_b0;
    R.m[2][1] = uStack_b0._4_4_;
    R.m[2][2] = local_a8;
    nifti_mat33_inverse(R);
    fVar7 = 1.0;
    fVar15 = 1.0;
    if (0.3 < local_d0) {
      A_01.m[0][2] = (float)uStack_c0;
      A_01.m[1][0] = uStack_c0._4_4_;
      A_01.m[0][0] = (float)local_c8;
      A_01.m[0][1] = local_c8._4_4_;
      A_01.m[1][1] = (float)local_b8;
      A_01.m[1][2] = local_b8._4_4_;
      A_01.m[2][0] = (float)uStack_b0;
      A_01.m[2][1] = uStack_b0._4_4_;
      A_01.m[2][2] = local_a8;
      fVar15 = nifti_mat33_rownorm(A_01);
      A_02.m[0][2] = (float)uStack_c0;
      A_02.m[1][0] = uStack_c0._4_4_;
      A_02.m[0][0] = (float)local_c8;
      A_02.m[0][1] = local_c8._4_4_;
      A_02.m[1][1] = (float)local_b8;
      A_02.m[1][2] = local_b8._4_4_;
      A_02.m[2][0] = (float)uStack_b0;
      A_02.m[2][1] = uStack_b0._4_4_;
      A_02.m[2][2] = local_a8;
      fVar7 = nifti_mat33_colnorm(A_02);
      fVar7 = fVar7 * fVar15;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      A_03.m[0][1] = fStack_94;
      A_03.m[0][0] = local_98;
      A_03.m[1][0] = fStack_8c;
      A_03.m[0][2] = fStack_90;
      A_03.m[1][2] = fStack_84;
      A_03.m[1][1] = local_88;
      A_03.m[2][1] = fStack_7c;
      A_03.m[2][0] = fStack_80;
      A_03.m[2][2] = local_78;
      fVar8 = nifti_mat33_rownorm(A_03);
      A_04.m[0][1] = fStack_94;
      A_04.m[0][0] = local_98;
      A_04.m[1][0] = fStack_8c;
      A_04.m[0][2] = fStack_90;
      A_04.m[1][2] = fStack_84;
      A_04.m[1][1] = local_88;
      A_04.m[2][1] = fStack_7c;
      A_04.m[2][0] = fStack_80;
      A_04.m[2][2] = local_78;
      fVar15 = nifti_mat33_colnorm(A_04);
      fVar15 = fVar15 * fVar8;
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar15 = fVar15 / fVar7;
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar7 = 1.0 / fVar15;
    }
    fVar6 = (fVar15 * (float)local_c8 + local_98 * fVar7) * 0.5;
    fVar11 = (fVar15 * local_c8._4_4_ + fStack_8c * fVar7) * 0.5;
    fVar12 = (fVar15 * (float)uStack_c0 + fStack_80 * fVar7) * 0.5;
    fVar13 = (fVar15 * uStack_c0._4_4_ + fStack_94 * fVar7) * 0.5;
    in_RDI->m[0][0] = fVar6;
    in_RDI->m[0][1] = fVar11;
    in_RDI->m[0][2] = fVar12;
    in_RDI->m[1][0] = fVar13;
    fVar8 = (fVar15 * (float)local_b8 + local_88 * fVar7) * 0.5;
    fVar9 = (fVar15 * local_b8._4_4_ + fStack_7c * fVar7) * 0.5;
    fVar10 = (fVar15 * (float)uStack_b0 + fStack_90 * fVar7) * 0.5;
    fVar14 = (fVar15 * uStack_b0._4_4_ + fStack_84 * fVar7) * 0.5;
    in_RDI->m[1][1] = fVar8;
    in_RDI->m[1][2] = fVar9;
    in_RDI->m[2][0] = fVar10;
    in_RDI->m[2][1] = fVar14;
    fVar15 = (fVar15 * local_a8 + fVar7 * local_78) * 0.5;
    in_RDI->m[2][2] = fVar15;
    if ((99 < uVar5) ||
       (local_d0 = ABS(fVar15 - local_a8) +
                   ABS(fVar14 - uStack_b0._4_4_) +
                   ABS(fVar10 - (float)uStack_b0) +
                   ABS(fVar9 - local_b8._4_4_) +
                   ABS(fVar8 - (float)local_b8) +
                   ABS(fVar13 - uStack_c0._4_4_) +
                   ABS(fVar12 - (float)uStack_c0) +
                   ABS(fVar11 - local_c8._4_4_) + ABS(fVar6 - (float)local_c8), local_d0 < 3e-06))
    break;
    uVar5 = uVar5 + 1;
    local_a8 = in_RDI->m[2][2];
    local_c8 = *(undefined8 *)in_RDI->m[0];
    uStack_c0 = *(undefined8 *)(in_RDI->m[0] + 2);
    local_b8 = *(undefined8 *)(in_RDI->m[1] + 1);
    uStack_b0 = *(undefined8 *)in_RDI->m[2];
  }
  return in_RDI;
}

Assistant:

mat33 nifti_mat33_polar( mat33 A )
{
   mat33 X , Y , Z ;
   float alp,bet,gam,gmi , dif=1.0f ;
   int k=0 ;

   X = A ;

   /* force matrix to be nonsingular */

   gam = nifti_mat33_determ(X) ;
   while( gam == 0.0 ){        /* perturb matrix */
     gam = (float)( 0.00001 * ( 0.001 + nifti_mat33_rownorm(X) ) ) ;
     X.m[0][0] += gam ; X.m[1][1] += gam ; X.m[2][2] += gam ;
     gam = nifti_mat33_determ(X) ;
   }

   while(1){
     Y = nifti_mat33_inverse(X) ;
     if( dif > 0.3 ){     /* far from convergence */
       alp = (float)( sqrt( nifti_mat33_rownorm(X) * nifti_mat33_colnorm(X) ) ) ;
       bet = (float)( sqrt( nifti_mat33_rownorm(Y) * nifti_mat33_colnorm(Y) ) ) ;
       gam = (float)( sqrt( bet / alp ) ) ;
       gmi = (float)( 1.0 / gam ) ;
     } else {
       gam = gmi = 1.0f ;  /* close to convergence */
     }
     Z.m[0][0] = (float)( 0.5 * ( gam*X.m[0][0] + gmi*Y.m[0][0] ) ) ;
     Z.m[0][1] = (float)( 0.5 * ( gam*X.m[0][1] + gmi*Y.m[1][0] ) ) ;
     Z.m[0][2] = (float)( 0.5 * ( gam*X.m[0][2] + gmi*Y.m[2][0] ) ) ;
     Z.m[1][0] = (float)( 0.5 * ( gam*X.m[1][0] + gmi*Y.m[0][1] ) ) ;
     Z.m[1][1] = (float)( 0.5 * ( gam*X.m[1][1] + gmi*Y.m[1][1] ) ) ;
     Z.m[1][2] = (float)( 0.5 * ( gam*X.m[1][2] + gmi*Y.m[2][1] ) ) ;
     Z.m[2][0] = (float)( 0.5 * ( gam*X.m[2][0] + gmi*Y.m[0][2] ) ) ;
     Z.m[2][1] = (float)( 0.5 * ( gam*X.m[2][1] + gmi*Y.m[1][2] ) ) ;
     Z.m[2][2] = (float)( 0.5 * ( gam*X.m[2][2] + gmi*Y.m[2][2] ) ) ;

     dif = (float)( fabs(Z.m[0][0]-X.m[0][0])+fabs(Z.m[0][1]-X.m[0][1])
          +fabs(Z.m[0][2]-X.m[0][2])+fabs(Z.m[1][0]-X.m[1][0])
          +fabs(Z.m[1][1]-X.m[1][1])+fabs(Z.m[1][2]-X.m[1][2])
          +fabs(Z.m[2][0]-X.m[2][0])+fabs(Z.m[2][1]-X.m[2][1])
          +fabs(Z.m[2][2]-X.m[2][2])                          );

     k = k+1 ;
     if( k > 100 || dif < 3.e-6 ) break ;  /* convergence or exhaustion */
     X = Z ;
   }

   return Z ;
}